

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::VariablePushPop::VariablePushPop(VariablePushPop *this,cmMakefile *m)

{
  cmMakefile *pcVar1;
  cmStateSnapshot local_28;
  
  this->Makefile = m;
  cmState::CreateVariableScopeSnapshot
            (&local_28,
             (m->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&m->StateSnapshot);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_28.Position.Position;
  (pcVar1->StateSnapshot).State = local_28.State;
  (pcVar1->StateSnapshot).Position.Tree = local_28.Position.Tree;
  return;
}

Assistant:

cmMakefile::VariablePushPop::VariablePushPop(cmMakefile* m)
  : Makefile(m)
{
  this->Makefile->StateSnapshot =
    this->Makefile->GetState()->CreateVariableScopeSnapshot(
      this->Makefile->StateSnapshot);
}